

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O2

int Abc_NodeBuildCutLevelOne_int
              (Vec_Ptr_t *vVisited,Vec_Ptr_t *vLeaves,int nSizeLimit,int nFaninLimit)

{
  void *pvVar1;
  long *plVar2;
  int *piVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  int i;
  long *plVar9;
  uint uVar10;
  ulong uVar8;
  
  plVar9 = (long *)0x0;
  uVar10 = 100;
  i = 0;
  do {
    uVar4 = vLeaves->nSize;
    if ((int)uVar4 <= i) {
      if (plVar9 != (long *)0x0) {
        if (2 < uVar10) {
          __assert_fail("CostBest < 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcReconv.c"
                        ,0x159,
                        "int Abc_NodeBuildCutLevelOne_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
        }
LAB_0027027c:
        if ((int)(uVar4 + uVar10 + -1) <= nSizeLimit) {
          if ((*(uint *)((long)plVar9 + 0x14) & 0xf) != 7) {
            __assert_fail("Abc_ObjIsNode(pFaninBest)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcReconv.c"
                          ,0x15e,
                          "int Abc_NodeBuildCutLevelOne_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
          }
          uVar7 = (ulong)uVar4;
          do {
            if ((int)uVar7 < 1) {
              __assert_fail("i >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
            }
            uVar8 = uVar7 - 1;
            lVar5 = uVar7 - 1;
            uVar7 = uVar8;
          } while ((long *)vLeaves->pArray[lVar5] != plVar9);
          while (uVar7 = uVar8 + 1, (int)uVar7 < (int)uVar4) {
            vLeaves->pArray[uVar8] = vLeaves->pArray[uVar7];
            uVar8 = uVar7;
          }
          vLeaves->nSize = uVar4 - 1;
          piVar3 = (int *)plVar9[4];
          lVar5 = *(long *)(*(long *)(*plVar9 + 0x20) + 8);
          pvVar1 = *(void **)(lVar5 + (long)*piVar3 * 8);
          if ((*(uint *)((long)pvVar1 + 0x14) & 0x20) == 0) {
            *(uint *)((long)pvVar1 + 0x14) = *(uint *)((long)pvVar1 + 0x14) | 0x20;
            Vec_PtrPush(vLeaves,pvVar1);
            Vec_PtrPush(vVisited,pvVar1);
            piVar3 = (int *)plVar9[4];
            lVar5 = *(long *)(*(long *)(*plVar9 + 0x20) + 8);
          }
          pvVar1 = *(void **)(lVar5 + (long)piVar3[1] * 8);
          if ((*(uint *)((long)pvVar1 + 0x14) & 0x20) == 0) {
            *(uint *)((long)pvVar1 + 0x14) = *(uint *)((long)pvVar1 + 0x14) | 0x20;
            Vec_PtrPush(vLeaves,pvVar1);
            Vec_PtrPush(vVisited,pvVar1);
          }
          if (vLeaves->nSize <= nSizeLimit) {
            return 1;
          }
          __assert_fail("vLeaves->nSize <= nSizeLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcReconv.c"
                        ,0x175,
                        "int Abc_NodeBuildCutLevelOne_int(Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
        }
      }
      return 0;
    }
    plVar2 = (long *)Vec_PtrEntry(vLeaves,i);
    uVar4 = *(uint *)((long)plVar2 + 0x14);
    if ((uVar4 & 0x20) == 0) {
      __assert_fail("pNode->fMarkB == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcReconv.c"
                    ,0x82,"int Abc_NodeGetLeafCostOne(Abc_Obj_t *, int)");
    }
    uVar6 = 999;
    if (((((uVar4 & 0xf) != 2) && ((uVar4 & 0xf) != 5)) &&
        (lVar5 = *(long *)(*(long *)(*plVar2 + 0x20) + 8),
        uVar6 = (uint)((*(byte *)(*(long *)(lVar5 + (long)((int *)plVar2[4])[1] * 8) + 0x14) & 0x20)
                      == 0) +
                (uint)((*(byte *)(*(long *)(lVar5 + (long)*(int *)plVar2[4] * 8) + 0x14) & 0x20) ==
                      0), 1 < uVar6)) && (uVar6 = 2, nFaninLimit < *(int *)((long)plVar2 + 0x2c))) {
      uVar6 = 999;
    }
    if (((uVar6 < uVar10) ||
        ((uVar10 == uVar6 && (*(uint *)((long)plVar9 + 0x14) >> 0xc < uVar4 >> 0xc)))) &&
       (plVar9 = plVar2, uVar10 = uVar6, uVar6 == 0)) {
      uVar4 = vLeaves->nSize;
      uVar10 = 0;
      goto LAB_0027027c;
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Abc_NodeBuildCutLevelOne_int( Vec_Ptr_t * vVisited, Vec_Ptr_t * vLeaves, int nSizeLimit, int nFaninLimit )
{
    Abc_Obj_t * pNode, * pFaninBest, * pNext;
    int CostBest, CostCur, i;
    // find the best fanin
    CostBest   = 100;
    pFaninBest = NULL;
//printf( "Evaluating fanins of the cut:\n" );
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pNode, i )
    {
        CostCur = Abc_NodeGetLeafCostOne( pNode, nFaninLimit );
//printf( "    Fanin %s has cost %d.\n", Abc_ObjName(pNode), CostCur );
//        if ( CostBest > CostCur ) // performance improvement: expand the variable with the smallest level
        if ( CostBest > CostCur ||
             (CostBest == CostCur && pNode->Level > pFaninBest->Level) )
        {
            CostBest   = CostCur;
            pFaninBest = pNode;
        }
        if ( CostBest == 0 )
            break;
    }
    if ( pFaninBest == NULL )
        return 0;
//        return Abc_NodeBuildCutLevelTwo_int( vVisited, vLeaves, nFaninLimit );

    assert( CostBest < 3 );
    if ( vLeaves->nSize - 1 + CostBest > nSizeLimit )
        return 0;
//        return Abc_NodeBuildCutLevelTwo_int( vVisited, vLeaves, nFaninLimit );

    assert( Abc_ObjIsNode(pFaninBest) );
    // remove the node from the array
    Vec_PtrRemove( vLeaves, pFaninBest );
//printf( "Removing fanin %s.\n", Abc_ObjName(pFaninBest) );

    // add the left child to the fanins
    pNext = Abc_ObjFanin0(pFaninBest);
    if ( !pNext->fMarkB )
    {
//printf( "Adding fanin %s.\n", Abc_ObjName(pNext) );
        pNext->fMarkB = 1;
        Vec_PtrPush( vLeaves, pNext );
        Vec_PtrPush( vVisited, pNext );
    }
    // add the right child to the fanins
    pNext = Abc_ObjFanin1(pFaninBest);
    if ( !pNext->fMarkB )
    {
//printf( "Adding fanin %s.\n", Abc_ObjName(pNext) );
        pNext->fMarkB = 1;
        Vec_PtrPush( vLeaves, pNext );
        Vec_PtrPush( vVisited, pNext );
    }
    assert( vLeaves->nSize <= nSizeLimit );
    // keep doing this
    return 1;
}